

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O0

void jpeg_set_quality(j_compress_ptr cinfo,int quality,boolean force_baseline)

{
  int iVar1;
  undefined4 in_EDX;
  int in_ESI;
  boolean in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  iVar1 = jpeg_quality_scaling(in_ESI);
  jpeg_set_linear_quality
            ((j_compress_ptr)CONCAT44(iVar1,in_EDX),in_stack_ffffffffffffffec,
             in_stack_ffffffffffffffe8);
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_quality(j_compress_ptr cinfo, int quality, boolean force_baseline)
/* Set or change the 'quality' (quantization) setting, using default tables.
 * This is the standard quality-adjusting entry point for typical user
 * interfaces; only those who want detailed control over quantization tables
 * would use the preceding three routines directly.
 */
{
  /* Convert user 0-100 rating to percentage scaling */
  quality = jpeg_quality_scaling(quality);

  /* Set up standard quality tables */
  jpeg_set_linear_quality(cinfo, quality, force_baseline);
}